

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFragmentOutputTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Functional::FragmentOutputCase::iterate(FragmentOutputCase *this)

{
  DataType DVar1;
  Precision PVar2;
  ChannelType CVar3;
  pointer puVar4;
  pointer puVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  float s;
  int iVar9;
  float fVar10;
  uint uVar11;
  TextureChannelClass TVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  deUint32 dVar16;
  int iVar17;
  AttachmentData *__cur;
  undefined4 extraout_var;
  pointer pBVar18;
  ulong uVar19;
  pointer pAVar20;
  pointer pfVar21;
  ostream *poVar22;
  TransferFormat TVar23;
  TestError *pTVar24;
  int ndx;
  float fVar25;
  uint uVar26;
  int iVar27;
  int iVar28;
  pointer pFVar29;
  ulong uVar30;
  ulong uVar31;
  Vector<long,_4> *a;
  char *description;
  byte bVar32;
  int i;
  int iVar33;
  ulong uVar34;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  long lVar35;
  Vector<float,_4> *a_00;
  int y;
  int iVar36;
  TextureFormat *pTVar37;
  pointer format;
  undefined4 uVar38;
  pointer puVar39;
  pointer pfVar40;
  Vec4 *a_01;
  ulong uVar41;
  unsigned_short uVar42;
  unsigned_short uVar43;
  int x_2;
  uint uVar44;
  int iVar45;
  ulong uVar46;
  long lVar47;
  int i_2;
  int iVar48;
  ulong uVar49;
  long lVar50;
  int x_1;
  long lVar51;
  bool bVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  undefined1 auVar56 [16];
  float fVar57;
  float fVar58;
  float fVar59;
  uint local_598;
  uint local_594;
  TextureFormat readFmt;
  Vec4 minVal;
  Vec4 maxVal;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4e8;
  ulong local_4d8;
  pointer local_4d0;
  uint local_4c8;
  IVec4 step;
  allocator<char> local_4b1;
  pointer local_4b0;
  TextureFormat local_4a8;
  Vector<float,_4> local_4a0;
  Vector<float,_4> local_490;
  vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
  local_480;
  Vec2 range;
  IVec4 rangeDiv;
  IVec2 range_1;
  IVec4 minVal_1;
  BVec4 isZero;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  inputs;
  Vector<float,_4> local_380;
  vector<unsigned_int,_std::allocator<unsigned_int>_> drawBuffers;
  vector<unsigned_short,_std::allocator<unsigned_short>_> indices;
  vector<float,_std::allocator<float>_> positions;
  TextureFormat texFmt;
  float afStack_320 [2];
  Vector<float,_4> local_318 [23];
  TextureFormat refFmt;
  undefined8 uStack_1a0;
  
  local_4a8 = (TextureFormat)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  iVar9 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar50 = CONCAT44(extraout_var,iVar9);
  pBVar18 = (this->m_fboSpec).
            super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_594 = 0x7fffffff;
  local_598 = 0x7fffffff;
  for (; pBVar18 !=
         (this->m_fboSpec).
         super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
         ._M_impl.super__Vector_impl_data._M_finish; pBVar18 = pBVar18 + 1) {
    if (pBVar18->width <= (int)local_598) {
      local_598 = pBVar18->width;
    }
    if (pBVar18->height <= (int)local_594) {
      local_594 = pBVar18->height;
    }
  }
  uVar44 = local_598 >> 3;
  if (0xfe < local_598 >> 3) {
    uVar44 = 0xff;
  }
  uVar31 = (ulong)uVar44;
  if ((int)local_598 < 8) {
    uVar31 = 1;
  }
  uVar44 = local_594 >> 3;
  if (0xfe < local_594 >> 3) {
    uVar44 = 0xff;
  }
  local_4d8 = (ulong)uVar44;
  if ((int)local_594 < 8) {
    local_4d8 = 1;
  }
  fVar10 = (float)((int)local_4d8 + SNORM_INT16);
  iVar17 = (int)uVar31;
  uVar44 = iVar17 * (int)local_4d8;
  iVar9 = 0;
  for (pFVar29 = (this->m_outputs).
                 super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pFVar29 !=
      (this->m_outputs).
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish; pFVar29 = pFVar29 + 1) {
    iVar48 = pFVar29->arrayLength;
    if (iVar48 < 2) {
      iVar48 = 1;
    }
    iVar9 = iVar9 + iVar48;
  }
  fVar25 = (float)(iVar17 + A);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&inputs,(long)iVar9,(allocator_type *)&texFmt);
  std::vector<float,_std::allocator<float>_>::vector
            (&positions,(ulong)(uint)((int)fVar25 * (int)fVar10 * 4),(allocator_type *)&texFmt);
  uVar11 = uVar44 * 6;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (&indices,(ulong)uVar11,(allocator_type *)&texFmt);
  uVar49 = (long)(this->m_fboSpec).
                 super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->m_fboSpec).
                 super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  uVar19 = uVar49 >> 4;
  iVar9 = (int)uVar19;
  uVar34 = (ulong)iVar9;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&drawBuffers,uVar34,(allocator_type *)&texFmt);
  if (0x199999999999999 < uVar34) {
    std::__throw_length_error("cannot create std::vector larger than max_size()");
  }
  if ((uVar49 & 0xfffffffff) == 0) {
    pAVar20 = (pointer)0x0;
  }
  else {
    pAVar20 = (pointer)operator_new(uVar34 * 0x50);
  }
  local_480.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pAVar20 + uVar34;
  local_480.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
  ._M_impl.super__Vector_impl_data._M_finish = pAVar20;
  while (bVar52 = uVar34 != 0, uVar34 = uVar34 - 1, bVar52) {
    (local_480.
     super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
     ._M_impl.super__Vector_impl_data._M_finish)->numWrittenChannels = 0;
    (local_480.
     super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
     ._M_impl.super__Vector_impl_data._M_finish)->outPrecision = PRECISION_LOWP;
    ((local_480.
      super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
      ._M_impl.super__Vector_impl_data._M_finish)->format).order = CHANNELORDER_LAST;
    ((local_480.
      super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
      ._M_impl.super__Vector_impl_data._M_finish)->format).type = CHANNELTYPE_LAST;
    ((local_480.
      super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
      ._M_impl.super__Vector_impl_data._M_finish)->referenceFormat).order = CHANNELORDER_LAST;
    ((local_480.
      super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
      ._M_impl.super__Vector_impl_data._M_finish)->referenceFormat).type = CHANNELTYPE_LAST;
    ((local_480.
      super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
      ._M_impl.super__Vector_impl_data._M_finish)->readFormat).order = CHANNELORDER_LAST;
    ((local_480.
      super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
      ._M_impl.super__Vector_impl_data._M_finish)->readFormat).type = CHANNELTYPE_LAST;
    ((local_480.
      super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
      ._M_impl.super__Vector_impl_data._M_finish)->renderedData).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ((local_480.
      super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
      ._M_impl.super__Vector_impl_data._M_finish)->renderedData).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ((local_480.
      super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
      ._M_impl.super__Vector_impl_data._M_finish)->renderedData).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ((local_480.
      super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
      ._M_impl.super__Vector_impl_data._M_finish)->referenceData).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ((local_480.
      super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
      ._M_impl.super__Vector_impl_data._M_finish)->referenceData).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ((local_480.
      super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
      ._M_impl.super__Vector_impl_data._M_finish)->referenceData).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_480.
    super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_480.
         super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  lVar47 = 0;
  uVar34 = 0;
  if (0 < iVar9) {
    uVar34 = uVar19 & 0xffffffff;
  }
  this_00 = &pAVar20->renderedData;
  iVar48 = 0x8ce0;
  lVar51 = 0x38;
  local_480.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
  ._M_impl.super__Vector_impl_data._M_start = pAVar20;
  for (; uVar34 * 4 != lVar47; lVar47 = lVar47 + 4) {
    texFmt = glu::mapGLInternalFormat
                       ((&((this->m_fboSpec).
                           super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                           ._M_impl.super__Vector_impl_data._M_start)->format)[lVar47]);
    TVar12 = tcu::getTextureChannelClass(texFmt.type);
    if (TVar12 < TEXTURECHANNELCLASS_SIGNED_INTEGER) {
      refFmt.type = FLOAT;
      refFmt.order = texFmt.order;
    }
    else {
      refFmt = texFmt;
    }
    readFmt = FboTestUtil::getFramebufferReadFormat(&texFmt);
    pBVar18 = (this->m_fboSpec).
              super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
              ._M_impl.super__Vector_impl_data._M_start;
    iVar14 = (&pBVar18->width)[lVar47];
    iVar45 = (&pBVar18->height)[lVar47];
    *(int *)((long)drawBuffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start + lVar47) = iVar48;
    this_00[-2].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)texFmt;
    *(TextureFormat *)&((TextureFormat *)(this_00 + -1))[1].order = readFmt;
    *(TextureFormat *)(this_00 + -1) = refFmt;
    iVar13 = tcu::TextureFormat::getPixelSize(&readFmt);
    iVar45 = iVar45 * iVar14;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (this_00,(long)(iVar13 * iVar45));
    pAVar20 = local_480.
              super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
              ._M_impl.super__Vector_impl_data._M_start;
    iVar14 = tcu::TextureFormat::getPixelSize(&refFmt);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               ((long)&(pAVar20->format).order + lVar51),(long)(iVar45 * iVar14));
    iVar48 = iVar48 + 1;
    this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
              &this_00[3].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
    lVar51 = lVar51 + 0x50;
  }
  puVar39 = indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start + 5;
  for (uVar19 = 0; uVar44 != uVar19; uVar19 = uVar19 + 1) {
    sVar8 = (short)((uVar19 & 0xffffffff) / uVar31);
    sVar7 = sVar8 * SUB42(fVar25,0);
    sVar6 = (short)((uVar19 & 0xffffffff) % uVar31);
    puVar39[-5] = sVar6 + sVar7;
    sVar8 = (sVar8 + 1) * SUB42(fVar25,0);
    uVar43 = sVar6 + sVar8;
    puVar39[-4] = uVar43;
    uVar42 = sVar7 + sVar6 + 1;
    puVar39[-3] = uVar42;
    puVar39[-2] = uVar43;
    puVar39[-1] = sVar8 + sVar6 + 1;
    *puVar39 = uVar42;
    puVar39 = puVar39 + 6;
  }
  fVar53 = (float)iVar17;
  fVar54 = (float)(int)local_4d8;
  uVar46 = (ulong)(uint)fVar25;
  uVar19 = (ulong)(uint)fVar10;
  pfVar21 = positions.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start + 2;
  for (uVar49 = 0; uVar49 != uVar19; uVar49 = uVar49 + 1) {
    fVar57 = (float)(int)uVar49 / fVar54;
    pfVar40 = pfVar21;
    for (uVar41 = 0; uVar46 != uVar41; uVar41 = uVar41 + 1) {
      fVar59 = (float)(int)uVar41 / fVar53;
      pfVar40[-2] = fVar59 + fVar59 + -1.0;
      pfVar40[-1] = fVar57 + fVar57 + -1.0;
      pfVar40[0] = 0.0;
      pfVar40[1] = 1.0;
      pfVar40 = pfVar40 + 4;
    }
    pfVar21 = pfVar21 + uVar31 * 4 + 4;
  }
  iVar48 = 0;
  for (lVar47 = 0;
      pFVar29 = (this->m_outputs).
                super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                ._M_impl.super__Vector_impl_data._M_start,
      lVar47 < (int)((ulong)((long)(this->m_outputs).
                                   super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar29) >> 4)
      ; lVar47 = lVar47 + 1) {
    DVar1 = pFVar29[lVar47].type;
    iVar14 = pFVar29[lVar47].arrayLength;
    if (iVar14 < 2) {
      iVar14 = 1;
    }
    uVar44 = glu::getDataTypeScalarSize(DVar1);
    local_4b0 = pFVar29 + lVar47;
    local_4c8 = DVar1 - TYPE_FLOAT;
    lVar51 = (long)(int)uVar44;
    iVar45 = 0;
    uVar31 = 0;
    if (0 < (int)uVar44) {
      uVar31 = (ulong)uVar44;
    }
    iVar13 = (int)fVar25 * uVar44;
LAB_006a181e:
    pFVar29 = local_4b0;
    if (iVar45 != iVar14) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (inputs.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + iVar48,
                 (long)(int)(uVar44 * (int)fVar25 * (int)fVar10));
      iVar15 = pFVar29->location + iVar45;
      pAVar20[iVar15].numWrittenChannels = uVar44;
      PVar2 = pFVar29->precision;
      uVar49 = (ulong)PVar2;
      pAVar20[iVar15].outPrecision = PVar2;
      if (local_4c8 < 4) {
        if ((getFloatRange(glu::Precision)::ranges == '\0') &&
           (iVar15 = __cxa_guard_acquire(&getFloatRange(glu::Precision)::ranges), iVar15 != 0)) {
          getFloatRange(glu::Precision)::ranges._0_8_ = 0x40000000c0000000;
          getFloatRange(glu::Precision)::ranges._8_8_ = 0x467a0000c67a0000;
          getFloatRange(glu::Precision)::ranges._16_8_ = 0x799a130cf99a130c;
          __cxa_guard_release(&getFloatRange(glu::Precision)::ranges);
        }
        tcu::Vector<float,_2>::Vector
                  (&range,(Vector<float,_2> *)(getFloatRange(glu::Precision)::ranges + uVar49 * 8));
        tcu::Vector<float,_4>::Vector(&minVal,range.m_data[0]);
        tcu::Vector<float,_4>::Vector(&maxVal,range.m_data[1]);
        pAVar20 = local_480.
                  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar4 = inputs.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[iVar48].
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar26 = local_4b0->location + iVar45;
        if ((-1 < (int)uVar26) &&
           ((int)uVar26 <
            (int)(((long)local_480.
                         super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_480.
                        super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x50))) {
          tcu::getTextureFormatInfo
                    ((TextureFormatInfo *)&texFmt,
                     &local_480.
                      super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar26].format);
          tcu::max<float,4>((tcu *)&refFmt,&minVal,(Vector<float,_4> *)&texFmt);
          minVal.m_data[0] = (float)refFmt.order;
          minVal.m_data[1] = (float)refFmt.type;
          minVal.m_data[2] = (float)uStack_1a0;
          minVal.m_data[3] = uStack_1a0._4_4_;
          tcu::min<float,4>((tcu *)&refFmt,&maxVal,local_318);
          maxVal.m_data[0] = (float)refFmt.order;
          maxVal.m_data[1] = (float)refFmt.type;
          maxVal.m_data[2] = (float)uStack_1a0;
          maxVal.m_data[3] = uStack_1a0._4_4_;
        }
        texFmt = (TextureFormat)
                 ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)afStack_320);
        std::operator<<((ostream *)afStack_320,"out");
        std::ostream::operator<<((ostringstream *)afStack_320,iVar48);
        std::operator<<((ostream *)afStack_320," value range: ");
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&refFmt);
        std::operator<<((ostream *)&refFmt,"(");
        lVar35 = 0;
        do {
          if (lVar35 != 0) {
            if (lVar35 == 4) goto LAB_006a1d9c;
            std::operator<<((ostream *)&refFmt,", ");
          }
          if (lVar35 < lVar51) {
            poVar22 = (ostream *)std::ostream::operator<<(&refFmt,minVal.m_data[lVar35]);
            poVar22 = std::operator<<(poVar22," -> ");
            std::ostream::operator<<(poVar22,maxVal.m_data[lVar35]);
          }
          else {
            std::operator<<((ostream *)&refFmt,"Undef");
          }
          lVar35 = lVar35 + 1;
        } while( true );
      }
      if (DVar1 - TYPE_INT < 4) {
        if ((getIntRange(glu::Precision)::ranges == '\0') &&
           (iVar15 = __cxa_guard_acquire(&getIntRange(glu::Precision)::ranges), iVar15 != 0)) {
          getIntRange(glu::Precision)::ranges._0_8_ = 0x7fffffff80;
          getIntRange(glu::Precision)::ranges._8_8_ = 0x7fffffff8000;
          getIntRange(glu::Precision)::ranges._16_8_ = 0x7fffffff80000000;
          __cxa_guard_release(&getIntRange(glu::Precision)::ranges);
        }
        tcu::Vector<int,_2>::Vector
                  (&range_1,(Vector<int,_2> *)(getIntRange(glu::Precision)::ranges + uVar49 * 8));
        tcu::Vector<int,_4>::Vector(&minVal_1,range_1.m_data[0]);
        tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&range,range_1.m_data[1]);
        pAVar20 = local_480.
                  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar26 = local_4b0->location + iVar45;
        if ((-1 < (int)uVar26) &&
           ((int)uVar26 <
            (int)(((long)local_480.
                         super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_480.
                        super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x50))) {
          tcu::getTextureFormatBitDepth
                    ((tcu *)&maxVal,
                     &local_480.
                      super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar26].format);
          tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&texFmt,0);
          tcu::lessThanEqual<int,4>
                    ((tcu *)&isZero,(Vector<int,_4> *)&maxVal,(Vector<int,_4> *)&texFmt);
          tcu::Vector<long,_4>::Vector((Vector<long,_4> *)&readFmt,1);
          tcu::operator-((tcu *)&step,(Vector<int,_4> *)&maxVal,1);
          tcu::Vector<int,_4>::cast<long>((Vector<long,_4> *)&minVal,&step);
          tcu::operator<<((Vector<long,_4> *)&refFmt,(Vector<long,_4> *)&readFmt,
                          (Vector<long,_4> *)&minVal);
          tcu::operator-((Vector<long,_4> *)&texFmt,(tcu *)&refFmt,a);
          tcu::Vector<long,_4>::cast<int>((Vector<long,_4> *)&rangeDiv);
          tcu::Vector<long,_4>::Vector((Vector<long,_4> *)&readFmt,1);
          tcu::operator-((tcu *)&local_4a0,(Vector<int,_4> *)&maxVal,1);
          tcu::Vector<int,_4>::cast<long>((Vector<long,_4> *)&minVal,(Vector<int,_4> *)&local_4a0);
          tcu::operator<<((Vector<long,_4> *)&refFmt,(Vector<long,_4> *)&readFmt,
                          (Vector<long,_4> *)&minVal);
          tcu::operator-((Vector<long,_4> *)&texFmt,(Vector<long,_4> *)&refFmt,1);
          tcu::Vector<long,_4>::cast<int>((Vector<long,_4> *)&step);
          tcu::max<int,4>((tcu *)&refFmt,&minVal_1,&rangeDiv);
          tcu::select<int,4>((tcu *)&texFmt,&minVal_1,(Vector<int,_4> *)&refFmt,&isZero);
          minVal_1.m_data[0] = texFmt.order;
          minVal_1.m_data[1] = texFmt.type;
          minVal_1.m_data[2] = (int)afStack_320[0];
          minVal_1.m_data[3] = (int)afStack_320[1];
          tcu::min<int,4>((tcu *)&refFmt,(Vector<int,_4> *)&range,&step);
          tcu::select<int,4>((tcu *)&texFmt,(Vector<int,_4> *)&range,(Vector<int,_4> *)&refFmt,
                             &isZero);
          range.m_data[0] = (float)texFmt.order;
          range.m_data[1] = (float)texFmt.type;
        }
        texFmt = (TextureFormat)
                 ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)afStack_320);
        std::operator<<((ostream *)afStack_320,"out");
        std::ostream::operator<<((ostringstream *)afStack_320,iVar48);
        std::operator<<((ostream *)afStack_320," value range: ");
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&refFmt);
        std::operator<<((ostream *)&refFmt,"(");
        lVar35 = 0;
        do {
          if (lVar35 != 0) {
            if (lVar35 == 4) goto LAB_006a2182;
            std::operator<<((ostream *)&refFmt,", ");
          }
          if (lVar35 < lVar51) {
            poVar22 = (ostream *)std::ostream::operator<<(&refFmt,minVal_1.m_data[lVar35]);
            poVar22 = std::operator<<(poVar22," -> ");
            std::ostream::operator<<(poVar22,(int)range.m_data[lVar35]);
          }
          else {
            std::operator<<((ostream *)&refFmt,"Undef");
          }
          lVar35 = lVar35 + 1;
        } while( true );
      }
      if (DVar1 - TYPE_UINT < 4) {
        if ((getUintRange(glu::Precision)::ranges == '\0') &&
           (iVar15 = __cxa_guard_acquire(&getUintRange(glu::Precision)::ranges), iVar15 != 0)) {
          getUintRange(glu::Precision)::ranges._0_8_ = 0xff00000000;
          getUintRange(glu::Precision)::ranges._8_8_ = 0xffff00000000;
          getUintRange(glu::Precision)::ranges._16_8_ = 0xffffffff00000000;
          __cxa_guard_release(&getUintRange(glu::Precision)::ranges);
        }
        tcu::Vector<unsigned_int,_2>::Vector
                  ((Vector<unsigned_int,_2> *)&rangeDiv,
                   (Vector<unsigned_int,_2> *)(getUintRange(glu::Precision)::ranges + uVar49 * 8));
        tcu::Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)&maxVal,rangeDiv.m_data[1]);
        pAVar20 = local_480.
                  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar26 = local_4b0->location + iVar45;
        if ((-1 < (int)uVar26) &&
           ((int)uVar26 <
            (int)(((long)local_480.
                         super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_480.
                        super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x50))) {
          tcu::getTextureFormatBitDepth
                    ((tcu *)&minVal_1,
                     &local_480.
                      super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar26].format);
          tcu::Vector<unsigned_long,_4>::Vector((Vector<unsigned_long,_4> *)&readFmt,1);
          tcu::Vector<int,_4>::cast<unsigned_long>
                    ((Vector<unsigned_long,_4> *)&minVal,(Vector<int,_4> *)&minVal_1);
          tcu::operator<<((Vector<unsigned_long,_4> *)&refFmt,(Vector<unsigned_long,_4> *)&readFmt,
                          (Vector<unsigned_long,_4> *)&minVal);
          tcu::operator-((Vector<unsigned_long,_4> *)&texFmt,(Vector<unsigned_long,_4> *)&refFmt,1);
          tcu::Vector<unsigned_long,_4>::cast<unsigned_int>((Vector<unsigned_long,_4> *)&range);
          tcu::min<unsigned_int,4>
                    ((tcu *)&texFmt,(Vector<unsigned_int,_4> *)&maxVal,
                     (Vector<unsigned_int,_4> *)&range);
          maxVal.m_data[0] = (float)texFmt.order;
          maxVal.m_data[1] = (float)texFmt.type;
          maxVal.m_data[2] = afStack_320[0];
          maxVal.m_data[3] = afStack_320[1];
        }
        texFmt = (TextureFormat)
                 ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)afStack_320);
        std::operator<<((ostream *)afStack_320,"out");
        std::ostream::operator<<((ostringstream *)afStack_320,iVar48);
        std::operator<<((ostream *)afStack_320," value range: ");
        tcu::Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)&minVal,0);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&refFmt);
        std::operator<<((ostream *)&refFmt,"(");
        lVar35 = 0;
        do {
          if (lVar35 != 0) {
            if (lVar35 == 4) goto LAB_006a23c0;
            std::operator<<((ostream *)&refFmt,", ");
          }
          if (lVar35 < lVar51) {
            poVar22 = std::ostream::_M_insert<unsigned_long>((ulong)&refFmt);
            poVar22 = std::operator<<(poVar22," -> ");
            std::ostream::_M_insert<unsigned_long>((ulong)poVar22);
          }
          else {
            std::operator<<((ostream *)&refFmt,"Undef");
          }
          lVar35 = lVar35 + 1;
        } while( true );
      }
      goto LAB_006a258c;
    }
  }
  (**(code **)(lVar50 + 0x1680))((this->m_program->m_program).m_program);
  (**(code **)(lVar50 + 0x78))(0x8d40,this->m_framebuffer);
  (**(code **)(lVar50 + 0x1a00))(0,0,local_598,local_594);
  (**(code **)(lVar50 + 0x560))
            ((ulong)((long)drawBuffers.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)drawBuffers.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2);
  (**(code **)(lVar50 + 0x4e8))(0xbd0);
  dVar16 = (**(code **)(lVar50 + 0x800))();
  glu::checkError(dVar16,"After program setup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragmentOutputTests.cpp"
                  ,0x303);
  iVar48 = 0;
  while( true ) {
    rangeDiv.m_data[0] = iVar48;
    pFVar29 = (this->m_outputs).
              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(this->m_outputs).
                            super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar29) >> 4) <=
        iVar48) break;
    DVar1 = pFVar29[iVar48].type;
    iVar14 = pFVar29[iVar48].arrayLength;
    iVar45 = glu::getDataTypeScalarSize(DVar1);
    step.m_data[0] = 0;
    uVar38 = 0;
    if (DVar1 - TYPE_UINT < 4) {
      uVar38 = 0x1405;
    }
    if (DVar1 - TYPE_INT < 4) {
      uVar38 = 0x1404;
    }
    iVar13 = 1;
    if (0 < iVar14) {
      iVar13 = pFVar29[iVar48].arrayLength;
    }
    for (; step.m_data[0] < iVar13; step.m_data[0] = step.m_data[0] + 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&readFmt,"in",(allocator<char> *)&local_4a0);
      de::toString<int>((string *)&minVal,rangeDiv.m_data);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&texFmt,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&readFmt,
                     (string *)&minVal);
      if (iVar14 < 1) {
        maxVal.m_data._0_8_ = &local_4e8;
        maxVal.m_data[2] = 0.0;
        maxVal.m_data[3] = 0.0;
        local_4e8._M_local_buf[0] = '\0';
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>((string *)&minVal_1,"_",&local_4b1);
        de::toString<int>((string *)&range,step.m_data);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&maxVal,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &minVal_1,(string *)&range);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&refFmt,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&texFmt,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&maxVal);
      std::__cxx11::string::~string((string *)&maxVal);
      if (0 < iVar14) {
        std::__cxx11::string::~string((string *)&range);
        std::__cxx11::string::~string((string *)&minVal_1);
      }
      std::__cxx11::string::~string((string *)&texFmt);
      std::__cxx11::string::~string((string *)&minVal);
      std::__cxx11::string::~string((string *)&readFmt);
      iVar48 = (**(code **)(lVar50 + 0x780))((this->m_program->m_program).m_program,refFmt);
      if (iVar48 < 0) {
        texFmt = local_4a8;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)afStack_320);
        std::operator<<((ostream *)afStack_320,"Warning: No location for attribute \'");
        std::operator<<((ostream *)afStack_320,(string *)&refFmt);
        std::operator<<((ostream *)afStack_320,"\' found.");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&texFmt,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)afStack_320);
      }
      else {
        (**(code **)(lVar50 + 0x610))(iVar48);
        if (DVar1 - TYPE_FLOAT < 4) {
          (**(code **)(lVar50 + 0x19f0))(iVar48,iVar45,0x1406,0);
        }
        else {
          (**(code **)(lVar50 + 0x1958))(iVar48,iVar45,uVar38,0);
        }
      }
      std::__cxx11::string::~string((string *)&refFmt);
    }
    iVar48 = rangeDiv.m_data[0] + 1;
  }
  iVar48 = (**(code **)(lVar50 + 0x780))((this->m_program->m_program).m_program);
  if (iVar48 < 0) {
    pTVar24 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar24,(char *)0x0,"posLoc >= 0",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragmentOutputTests.cpp"
               ,0x32a);
    __cxa_throw(pTVar24,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar50 + 0x610))(iVar48);
  (**(code **)(lVar50 + 0x19f0))
            (iVar48,4,0x1406,0,0,
             positions.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start);
  dVar16 = (**(code **)(lVar50 + 0x800))();
  glu::checkError(dVar16,"After attribute setup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragmentOutputTests.cpp"
                  ,0x32e);
  (**(code **)(lVar50 + 0x568))
            (4,uVar11,0x1403,
             indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start);
  dVar16 = (**(code **)(lVar50 + 0x800))();
  glu::checkError(dVar16,"glDrawElements",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragmentOutputTests.cpp"
                  ,0x331);
  pAVar20 = local_480.
            super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
            ._M_impl.super__Vector_impl_data._M_start;
  for (uVar31 = 0; uVar31 != uVar34; uVar31 = uVar31 + 1) {
    TVar23 = glu::getTransferFormat(pAVar20[uVar31].readFormat);
    puVar5 = pAVar20[uVar31].renderedData.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar18 = (this->m_fboSpec).
              super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
              ._M_impl.super__Vector_impl_data._M_start;
    iVar48 = pBVar18[uVar31].width;
    iVar14 = pBVar18[uVar31].height;
    uVar44 = pAVar20[uVar31].numWrittenChannels;
    iVar45 = tcu::TextureFormat::getPixelSize(&pAVar20[uVar31].readFormat);
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&texFmt,&pAVar20[uVar31].readFormat,iVar48,iVar14,1,
               iVar45 * iVar48 + 3U & 0xfffffffc,0,
               pAVar20[uVar31].renderedData.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
    (**(code **)(lVar50 + 0x1218))((int)uVar31 + 0x8ce0);
    (**(code **)(lVar50 + 0x1220))(0,0,local_598,local_594,TVar23,(ulong)TVar23 >> 0x20,puVar5);
    iVar48 = 0;
    uVar19 = (ulong)uVar44;
    if ((int)uVar44 < 1) {
      uVar19 = 0;
    }
    for (; iVar48 < (int)afStack_320[1]; iVar48 = iVar48 + 1) {
      for (iVar14 = 0; iVar14 < (int)afStack_320[0]; iVar14 = iVar14 + 1) {
        TVar12 = tcu::getTextureChannelClass(texFmt.type);
        iVar45 = (int)&texFmt;
        if (TVar12 < TEXTURECHANNELCLASS_FLOATING_POINT) {
          tcu::getTextureFormatBitDepth((tcu *)&refFmt,&texFmt);
          tcu::ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)&readFmt,iVar45,iVar14,iVar48);
          minVal.m_data[0] = 0.0;
          minVal.m_data[1] = 0.0;
          minVal.m_data._8_8_ = (ulong)(uint)~(-1 << (uStack_1a0._4_1_ & 0x1f)) << 0x20;
          for (uVar49 = 0; uVar19 != uVar49; uVar49 = uVar49 + 1) {
            minVal.m_data[uVar49] = (float)(&readFmt.order)[uVar49];
          }
          tcu::PixelBufferAccess::setPixel
                    ((PixelBufferAccess *)&texFmt,(IVec4 *)&minVal,iVar14,iVar48,0);
        }
        else if (TVar12 == TEXTURECHANNELCLASS_FLOATING_POINT) {
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)&refFmt,iVar45,iVar14,iVar48);
          readFmt.order = R;
          readFmt.type = SNORM_INT8;
          for (uVar49 = 0; uVar19 != uVar49; uVar49 = uVar49 + 1) {
            (&readFmt.order)[uVar49] = (&refFmt.order)[uVar49];
          }
          tcu::PixelBufferAccess::setPixel
                    ((PixelBufferAccess *)&texFmt,(Vec4 *)&readFmt,iVar14,iVar48,0);
        }
      }
    }
  }
  iVar17 = iVar17 + -1;
  local_4d8 = (ulong)((int)local_4d8 - 1);
  iVar48 = 0;
  for (lVar50 = 0;
      pFVar29 = (this->m_outputs).
                super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                ._M_impl.super__Vector_impl_data._M_start,
      lVar50 < (int)((ulong)((long)(this->m_outputs).
                                   super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar29) >> 4)
      ; lVar50 = lVar50 + 1) {
    DVar1 = pFVar29[lVar50].type;
    iVar14 = pFVar29[lVar50].arrayLength;
    iVar45 = glu::getDataTypeScalarSize(DVar1);
    uVar11 = 0;
    uVar44 = pFVar29[lVar50].arrayLength;
    if (pFVar29[lVar50].arrayLength < 1) {
      uVar44 = uVar11;
    }
    if (iVar14 < 1) {
      uVar44 = 1;
    }
    while (uVar11 != uVar44) {
      iVar14 = pFVar29[lVar50].location + uVar11;
      puVar4 = inputs.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar48].
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pBVar18 = (this->m_fboSpec).
                super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_4c8 = uVar11;
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&texFmt,&pAVar20[iVar14].referenceFormat,pBVar18[iVar14].width
                 ,pBVar18[iVar14].height,1,
                 pAVar20[iVar14].referenceData.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start);
      tcu::getSubregion((PixelBufferAccess *)&refFmt,(PixelBufferAccess *)&texFmt,0,0,0,local_598,
                        local_594,1);
      if (DVar1 - TYPE_INT < 8) {
        for (iVar14 = 0; iVar14 < (int)uStack_1a0._4_4_; iVar14 = iVar14 + 1) {
          fVar10 = floorf((float)iVar14 / ((float)(int)uStack_1a0._4_4_ / fVar54));
          iVar15 = (int)fVar10;
          iVar13 = (int)local_4d8;
          if (iVar15 < (int)local_4d8) {
            iVar13 = iVar15;
          }
          iVar36 = 0;
          if (iVar15 < 0) {
            iVar13 = 0;
          }
          for (; iVar36 < (int)(float)uStack_1a0; iVar36 = iVar36 + 1) {
            fVar10 = floorf((float)iVar36 / ((float)(int)(float)uStack_1a0 / fVar53));
            iVar27 = (int)fVar10;
            iVar15 = iVar27;
            if (iVar17 <= iVar27) {
              iVar15 = iVar17;
            }
            iVar28 = 0;
            if (-1 < iVar27) {
              iVar28 = iVar15;
            }
            lVar47 = (long)((iVar28 + iVar13 * (int)fVar25 + 1) * iVar45);
            if (iVar45 < 2) {
              readFmt.type = SNORM_INT8;
            }
            else {
              readFmt.type = puVar4[lVar47 + 1];
            }
            readFmt.order = puVar4[lVar47];
            tcu::PixelBufferAccess::setPixel
                      ((PixelBufferAccess *)&refFmt,(IVec4 *)&readFmt,iVar36,iVar14,0);
          }
        }
      }
      else if (DVar1 - TYPE_FLOAT < 4) {
        bVar52 = tcu::isSRGB(refFmt);
        local_4d0 = (pointer)CONCAT71(local_4d0._1_7_,bVar52);
        fVar10 = (float)(int)(float)uStack_1a0 / fVar53;
        fVar57 = (float)(int)uStack_1a0._4_4_ / fVar54;
        for (iVar14 = 0; iVar14 < (int)uStack_1a0._4_4_; iVar14 = iVar14 + 1) {
          fVar59 = floorf((float)iVar14 / fVar57);
          iVar15 = (int)fVar59;
          iVar13 = (int)local_4d8;
          if (iVar15 < (int)local_4d8) {
            iVar13 = iVar15;
          }
          iVar36 = 0;
          if (iVar15 < 0) {
            iVar13 = 0;
          }
          fVar59 = (((float)iVar14 - (float)iVar13 * fVar57) + 0.5) / fVar57;
          iVar15 = (iVar13 + 1) * (int)fVar25;
          local_4b0 = (pointer)CONCAT44(local_4b0._4_4_,1.0 - fVar59);
          for (; iVar36 < (int)(float)uStack_1a0; iVar36 = iVar36 + 1) {
            fVar55 = floorf((float)iVar36 / fVar10);
            iVar28 = (int)fVar55;
            iVar27 = iVar28;
            if (iVar17 <= iVar28) {
              iVar27 = iVar17;
            }
            iVar33 = 0;
            if (-1 < iVar28) {
              iVar33 = iVar27;
            }
            fVar58 = (((float)iVar36 - (float)iVar33 * fVar10) + 0.5) / fVar10;
            readVec4((float *)(puVar4 + (iVar33 + iVar13 * (int)fVar25) * iVar45),iVar45);
            a_01 = &minVal;
            readVec4((float *)(puVar4 + (iVar33 + iVar15) * iVar45),iVar45);
            a_00 = &maxVal;
            readVec4((float *)(puVar4 + (iVar33 + iVar13 * (int)fVar25 + 1) * iVar45),iVar45);
            pTVar37 = (TextureFormat *)&rangeDiv;
            readVec4((float *)(puVar4 + (iVar33 + iVar15 + 1) * iVar45),iVar45);
            fVar55 = fVar59 + fVar58;
            if (fVar55 < 1.0) {
              pTVar37 = &readFmt;
              a_01 = &maxVal;
              a_00 = &minVal;
            }
            s = local_4b0._0_4_;
            if (fVar55 < 1.0) {
              s = fVar59;
            }
            tcu::operator-((tcu *)&isZero,a_01,(Vector<float,_4> *)pTVar37);
            tcu::operator*((tcu *)&range_1,
                           (float)(~-(uint)(1.0 <= fVar55) & (uint)fVar58 |
                                  (uint)(1.0 - fVar58) & -(uint)(1.0 <= fVar55)),
                           (Vector<float,_4> *)&isZero);
            tcu::operator+((tcu *)&local_4a0,(Vector<float,_4> *)pTVar37,
                           (Vector<float,_4> *)&range_1);
            tcu::operator-((tcu *)&local_380,a_00,(Vector<float,_4> *)pTVar37);
            tcu::operator*((tcu *)&local_490,s,&local_380);
            tcu::operator+((tcu *)&step,&local_4a0,&local_490);
            if ((char)local_4d0 == '\0') {
              tcu::Vector<float,_4>::Vector(&local_4a0,(Vector<float,_4> *)&step);
            }
            else {
              tcu::linearToSRGB((tcu *)&local_4a0,(Vec4 *)&step);
            }
            tcu::PixelBufferAccess::setPixel
                      ((PixelBufferAccess *)&refFmt,&local_4a0,iVar36,iVar14,0);
          }
        }
      }
      iVar48 = iVar48 + 1;
      uVar11 = local_4c8 + 1;
    }
  }
  bVar32 = 1;
  fVar10 = 0.0;
  do {
    local_490.m_data[0] = fVar10;
    if (iVar9 <= (int)fVar10) {
      description = "Image comparison failed";
      if (bVar32 != 0) {
        description = "Pass";
      }
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 (byte)~bVar32 & QP_TEST_RESULT_FAIL,description);
      std::
      vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
      ::~vector(&local_480);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&drawBuffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                (&indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&positions.super__Vector_base<float,_std::allocator<float>_>);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector(&inputs);
      return STOP;
    }
    pBVar18 = (this->m_fboSpec).
              super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
              ._M_impl.super__Vector_impl_data._M_start;
    iVar17 = pBVar18[(int)fVar10].width;
    iVar48 = pBVar18[(int)fVar10].height;
    pTVar37 = &pAVar20[(int)fVar10].readFormat;
    iVar14 = *(int *)(pTVar37 + 1);
    auVar56._0_4_ = -(uint)(0 < iVar14);
    auVar56._4_4_ = -(uint)(1 < iVar14);
    auVar56._8_4_ = -(uint)(2 < iVar14);
    auVar56._12_4_ = -(uint)(3 < iVar14);
    auVar56 = packssdw(auVar56,auVar56);
    auVar56 = packsswb(auVar56,auVar56);
    local_380.m_data[0] = (float)(auVar56._0_4_ & (uint)DAT_009b0350);
    PVar2 = *(Precision *)((long)(pTVar37 + 1) + 4);
    iVar45 = tcu::TextureFormat::getPixelSize(pTVar37);
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              ((ConstPixelBufferAccess *)&refFmt,pTVar37,iVar17,iVar48,1,
               iVar45 * iVar17 + 3U & 0xfffffffc,0,
               pAVar20[(int)local_490.m_data[0]].renderedData.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              ((ConstPixelBufferAccess *)&readFmt,&pAVar20[(int)local_490.m_data[0]].referenceFormat
               ,iVar17,iVar48,1,
               pAVar20[(int)local_490.m_data[0]].referenceData.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
    format = pAVar20 + (int)fVar10;
    TVar12 = tcu::getTextureChannelClass((format->format).type);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&texFmt,"Attachment",(allocator<char> *)&rangeDiv);
    de::toString<int>((string *)&maxVal,(int *)&local_490);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&minVal,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&texFmt,
                   (string *)&maxVal);
    std::__cxx11::string::~string((string *)&maxVal);
    std::__cxx11::string::~string((string *)&texFmt);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&texFmt,"Color attachment ",(allocator<char> *)&step);
    de::toString<int>((string *)&rangeDiv,(int *)&local_490);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&maxVal,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&texFmt,
                   (string *)&rangeDiv);
    std::__cxx11::string::~string((string *)&rangeDiv);
    std::__cxx11::string::~string((string *)&texFmt);
    texFmt = local_4a8;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)afStack_320);
    std::operator<<((ostream *)afStack_320,"Attachment ");
    std::ostream::operator<<((ostringstream *)afStack_320,(int)local_490.m_data[0]);
    std::operator<<((ostream *)afStack_320,": ");
    std::ostream::operator<<((ostringstream *)afStack_320,iVar14);
    std::operator<<((ostream *)afStack_320," channels have defined values and used for comparison");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&texFmt,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)afStack_320);
    if (TVar12 - TEXTURECHANNELCLASS_SIGNED_INTEGER < 2) {
      tcu::Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)&rangeDiv,0);
      tcu::Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)&step,0xffffffff);
      tcu::select<unsigned_int,4>
                ((tcu *)&texFmt,(Vector<unsigned_int,_4> *)&rangeDiv,
                 (Vector<unsigned_int,_4> *)&step,(Vector<bool,_4> *)&local_380);
      bVar52 = tcu::intThresholdCompare
                         ((TestLog *)local_4a8,(char *)minVal.m_data._0_8_,
                          (char *)maxVal.m_data._0_8_,(ConstPixelBufferAccess *)&readFmt,
                          (ConstPixelBufferAccess *)&refFmt,(UVec4 *)&texFmt,COMPARE_LOG_RESULT);
    }
    else if (TVar12 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
      tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&rangeDiv,8);
      tcu::getTextureFormatBitDepth((tcu *)&step,&format->format);
      tcu::min<int,4>((tcu *)&texFmt,(Vector<int,_4> *)&rangeDiv,(Vector<int,_4> *)&step);
      tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&isZero,1);
      tcu::operator<<((tcu *)&range_1,(Vector<int,_4> *)&isZero,(Vector<int,_4> *)&texFmt);
      tcu::operator-((tcu *)&local_4a0,(Vector<int,_4> *)&range_1,1);
      tcu::Vector<int,_4>::cast<float>((Vector<int,_4> *)&step);
      tcu::operator/((tcu *)&rangeDiv,1.0,(Vector<float,_4> *)&step);
      tcu::Vector<float,_4>::Vector(&local_4a0,2.0);
      tcu::select<float,4>
                ((tcu *)&step,(Vector<float,_4> *)&rangeDiv,&local_4a0,(Vector<bool,_4> *)&local_380
                );
      bVar52 = tcu::floatThresholdCompare
                         ((TestLog *)local_4a8,(char *)minVal.m_data._0_8_,
                          (char *)maxVal.m_data._0_8_,(ConstPixelBufferAccess *)&readFmt,
                          (ConstPixelBufferAccess *)&refFmt,(Vec4 *)&step,COMPARE_LOG_RESULT);
    }
    else {
      if (TVar12 != TEXTURECHANNELCLASS_FLOATING_POINT) {
        pTVar24 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar24,"Unsupported comparison",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragmentOutputTests.cpp"
                   ,0x3b4);
        __cxa_throw(pTVar24,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      tcu::Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)&texFmt);
      tcu::Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)&rangeDiv);
      CVar3 = (format->format).type;
      if (CVar3 == UNSIGNED_INT_11F_11F_10F_REV) {
        texFmt.order = 0x20000;
        texFmt.type = 0x20000;
        afStack_320 = (float  [2])0x40000;
      }
      else {
        if (CVar3 == HALF_FLOAT) {
          uVar44 = 0x2000;
        }
        else {
          if (CVar3 != FLOAT) goto LAB_006a379d;
          uVar44 = 0;
        }
        tcu::Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)&step,uVar44);
        texFmt.type = step.m_data[1];
        texFmt.order = step.m_data[0];
        afStack_320[0] = (float)step.m_data[2];
        afStack_320[1] = (float)step.m_data[3];
      }
LAB_006a379d:
      uVar44 = 4;
      if (PVar2 == PRECISION_MEDIUMP) {
        uVar44 = 0x2000;
      }
      if (PVar2 == PRECISION_LOWP) {
        uVar44 = 0x8000;
      }
      tcu::Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)&range_1,uVar44);
      tcu::max<unsigned_int,4>
                ((tcu *)&local_4a0,(Vector<unsigned_int,_4> *)&texFmt,
                 (Vector<unsigned_int,_4> *)&range_1);
      tcu::Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)&isZero,0xffffffff);
      tcu::select<unsigned_int,4>
                ((tcu *)&step,(Vector<unsigned_int,_4> *)&local_4a0,
                 (Vector<unsigned_int,_4> *)&isZero,(Vector<bool,_4> *)&local_380);
      rangeDiv.m_data[1] = step.m_data[1];
      rangeDiv.m_data[0] = step.m_data[0];
      rangeDiv.m_data[2] = step.m_data[2];
      rangeDiv.m_data[3] = step.m_data[3];
      bVar52 = tcu::floatUlpThresholdCompare
                         ((TestLog *)local_4a8,(char *)minVal.m_data._0_8_,
                          (char *)maxVal.m_data._0_8_,(ConstPixelBufferAccess *)&readFmt,
                          (ConstPixelBufferAccess *)&refFmt,(UVec4 *)&rangeDiv,COMPARE_LOG_RESULT);
    }
    bVar32 = bVar32 & bVar52;
    std::__cxx11::string::~string((string *)&maxVal);
    std::__cxx11::string::~string((string *)&minVal);
    fVar10 = (float)((int)local_490.m_data[0] + 1);
  } while( true );
LAB_006a1d9c:
  std::operator<<((ostream *)&refFmt,")");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&refFmt);
  std::operator<<((ostream *)afStack_320,(string *)&readFmt);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&texFmt,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_4d0 = pAVar20;
  std::__cxx11::string::~string((string *)&readFmt);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)afStack_320);
  iVar15 = 0;
  for (uVar49 = 0; pAVar20 = local_4d0, uVar49 != uVar19; uVar49 = uVar49 + 1) {
    fVar57 = (float)(int)uVar49 / fVar54;
    iVar36 = iVar15;
    for (uVar41 = 0; uVar41 != uVar46; uVar41 = uVar41 + 1) {
      fVar59 = (float)(int)uVar41 / fVar53;
      refFmt.order = (ChannelOrder)((fVar57 + fVar59) * 0.5);
      refFmt.type = (ChannelType)((fVar59 - fVar57) * 0.5 + 0.5);
      uStack_1a0 = CONCAT44(1.0 - (float)refFmt.type,1.0 - (float)refFmt.order);
      swizzleVec<float>((Functional *)&texFmt,(Vector<float,_4> *)&refFmt,iVar48);
      tcu::operator-((tcu *)&minVal_1,&maxVal,&minVal);
      tcu::operator*((tcu *)&readFmt,(Vector<float,_4> *)&minVal_1,(Vector<float,_4> *)&texFmt);
      tcu::operator+((tcu *)&refFmt,&minVal,(Vector<float,_4> *)&readFmt);
      for (uVar30 = 0; uVar31 != uVar30; uVar30 = uVar30 + 1) {
        puVar4[(long)iVar36 + uVar30] = (&refFmt.order)[uVar30];
      }
      iVar36 = iVar36 + uVar44;
    }
    iVar15 = iVar15 + iVar13;
  }
  goto LAB_006a258c;
LAB_006a2182:
  std::operator<<((ostream *)&refFmt,")");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&refFmt);
  std::operator<<((ostream *)afStack_320,(string *)&readFmt);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&texFmt,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&readFmt);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)afStack_320);
  refFmt.type = (ChannelType)fVar10;
  refFmt.order = (ChannelOrder)fVar25;
  uStack_1a0 = CONCAT44(fVar10,fVar25);
  tcu::operator-((tcu *)&texFmt,(Vector<int,_4> *)&refFmt,1);
  swizzleVec<int>((Functional *)&rangeDiv,(Vector<int,_4> *)&texFmt,iVar48);
  tcu::Vector<int,_4>::cast<long>((Vector<long,_4> *)&readFmt,(Vector<int,_4> *)&range);
  tcu::Vector<int,_4>::cast<long>((Vector<long,_4> *)&minVal,&minVal_1);
  tcu::operator-((Vector<long,_4> *)&refFmt,(Vector<long,_4> *)&readFmt,(Vector<long,_4> *)&minVal);
  tcu::Vector<int,_4>::cast<long>((Vector<long,_4> *)&maxVal,&rangeDiv);
  tcu::operator/((Vector<long,_4> *)&texFmt,(Vector<long,_4> *)&refFmt,(Vector<long,_4> *)&maxVal);
  tcu::Vector<long,_4>::cast<int>((Vector<long,_4> *)&step);
  local_4d0 = pAVar20;
  puVar4 = inputs.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[iVar48].
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar15 = 0;
  for (uVar49 = 0; pAVar20 = local_4d0, uVar49 != uVar19; uVar49 = uVar49 + 1) {
    iVar27 = (int)local_4d8;
    iVar36 = iVar15;
    for (uVar41 = 0; uVar41 != uVar46; uVar41 = uVar41 + 1) {
      minVal.m_data[1] = (float)uVar49;
      minVal.m_data[0] = (float)uVar41;
      minVal.m_data[3] = (float)(iVar27 - (int)(float)uVar49);
      minVal.m_data[2] = (float)(iVar17 - (int)(float)uVar41);
      swizzleVec<int>((Functional *)&readFmt,(Vector<int,_4> *)&minVal,iVar48);
      tcu::operator*((tcu *)&refFmt,&step,(Vector<int,_4> *)&readFmt);
      tcu::operator+((tcu *)&texFmt,&minVal_1,(Vector<int,_4> *)&refFmt);
      for (uVar30 = 0; uVar31 != uVar30; uVar30 = uVar30 + 1) {
        puVar4[(long)iVar36 + uVar30] = (&texFmt.order)[uVar30];
      }
      iVar36 = iVar36 + uVar44;
    }
    iVar15 = iVar15 + iVar13;
  }
  goto LAB_006a258c;
LAB_006a23c0:
  std::operator<<((ostream *)&refFmt,")");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&refFmt);
  std::operator<<((ostream *)afStack_320,(string *)&readFmt);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&texFmt,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&readFmt);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)afStack_320);
  readFmt.type = (ChannelType)fVar10;
  readFmt.order = (ChannelOrder)fVar25;
  tcu::operator-((tcu *)&refFmt,(Vector<int,_4> *)&readFmt,1);
  swizzleVec<int>((Functional *)&texFmt,(Vector<int,_4> *)&refFmt,iVar48);
  local_4d0 = pAVar20;
  tcu::Vector<int,_4>::cast<unsigned_int>((Vector<int,_4> *)&readFmt);
  tcu::operator/((tcu *)&refFmt,(Vector<unsigned_int,_4> *)&maxVal,
                 (Vector<unsigned_int,_4> *)&readFmt);
  puVar4 = inputs.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[iVar48].
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar15 = 0;
  for (uVar49 = 0; pAVar20 = local_4d0, uVar49 != uVar19; uVar49 = uVar49 + 1) {
    iVar36 = iVar15;
    for (uVar41 = 0; uVar41 != uVar46; uVar41 = uVar41 + 1) {
      range.m_data[1] = (float)uVar49;
      range.m_data[0] = (float)uVar41;
      tcu::Vector<int,_4>::cast<unsigned_int>(&minVal_1);
      swizzleVec<unsigned_int>((Functional *)&minVal,(Vector<unsigned_int,_4> *)&minVal_1,iVar48);
      tcu::operator*((tcu *)&readFmt,(Vector<unsigned_int,_4> *)&refFmt,
                     (Vector<unsigned_int,_4> *)&minVal);
      for (uVar30 = 0; uVar31 != uVar30; uVar30 = uVar30 + 1) {
        puVar4[(long)iVar36 + uVar30] = (&readFmt.order)[uVar30];
      }
      iVar36 = iVar36 + uVar44;
    }
    iVar15 = iVar15 + iVar13;
  }
LAB_006a258c:
  iVar48 = iVar48 + 1;
  iVar45 = iVar45 + 1;
  goto LAB_006a181e;
}

Assistant:

FragmentOutputCase::IterateResult FragmentOutputCase::iterate (void)
{
	TestLog&					log					= m_testCtx.getLog();
	const glw::Functions&		gl					= m_context.getRenderContext().getFunctions();

	// Compute grid size & index list.
	const int					minCellSize			= 8;
	const IVec2					minBufSize			= getMinSize(m_fboSpec);
	const int					gridWidth			= de::clamp(minBufSize.x()/minCellSize, 1, 255)+1;
	const int					gridHeight			= de::clamp(minBufSize.y()/minCellSize, 1, 255)+1;
	const int					numVertices			= gridWidth*gridHeight;
	const int					numQuads			= (gridWidth-1)*(gridHeight-1);
	const int					numIndices			= numQuads*6;

	const int					numInputVecs		= getNumInputVectors(m_outputs);
	vector<vector<deUint32> >	inputs				(numInputVecs);
	vector<float>				positions			(numVertices*4);
	vector<deUint16>			indices				(numIndices);

	const int					readAlignment		= 4;
	const int					viewportW			= minBufSize.x();
	const int					viewportH			= minBufSize.y();
	const int					numAttachments		= (int)m_fboSpec.size();

	vector<deUint32>			drawBuffers			(numAttachments);
	vector<AttachmentData>		attachments			(numAttachments);

	// Initialize attachment data.
	for (int ndx = 0; ndx < numAttachments; ndx++)
	{
		const tcu::TextureFormat		texFmt			= glu::mapGLInternalFormat(m_fboSpec[ndx].format);
		const tcu::TextureChannelClass	chnClass		= tcu::getTextureChannelClass(texFmt.type);
		const bool						isFixedPoint	= chnClass == tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT ||
														  chnClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT;

		// \note Fixed-point formats use float reference to enable more accurate result verification.
		const tcu::TextureFormat		refFmt			= isFixedPoint ? tcu::TextureFormat(texFmt.order, tcu::TextureFormat::FLOAT) : texFmt;
		const tcu::TextureFormat		readFmt			= getFramebufferReadFormat(texFmt);
		const int						attachmentW		= m_fboSpec[ndx].width;
		const int						attachmentH		= m_fboSpec[ndx].height;

		drawBuffers[ndx]					= GL_COLOR_ATTACHMENT0+ndx;
		attachments[ndx].format				= texFmt;
		attachments[ndx].readFormat			= readFmt;
		attachments[ndx].referenceFormat	= refFmt;
		attachments[ndx].renderedData.resize(readFmt.getPixelSize()*attachmentW*attachmentH);
		attachments[ndx].referenceData.resize(refFmt.getPixelSize()*attachmentW*attachmentH);
	}

	// Initialize indices.
	for (int quadNdx = 0; quadNdx < numQuads; quadNdx++)
	{
		int	quadY	= quadNdx / (gridWidth-1);
		int quadX	= quadNdx - quadY*(gridWidth-1);

		indices[quadNdx*6+0] = deUint16(quadX + quadY*gridWidth);
		indices[quadNdx*6+1] = deUint16(quadX + (quadY+1)*gridWidth);
		indices[quadNdx*6+2] = deUint16(quadX + quadY*gridWidth + 1);
		indices[quadNdx*6+3] = indices[quadNdx*6+1];
		indices[quadNdx*6+4] = deUint16(quadX + (quadY+1)*gridWidth + 1);
		indices[quadNdx*6+5] = indices[quadNdx*6+2];
	}

	for (int y = 0; y < gridHeight; y++)
	{
		for (int x = 0; x < gridWidth; x++)
		{
			float	xf	= (float)x / (float)(gridWidth-1);
			float	yf	= (float)y / (float)(gridHeight-1);

			positions[(y*gridWidth + x)*4 + 0] = 2.0f*xf - 1.0f;
			positions[(y*gridWidth + x)*4 + 1] = 2.0f*yf - 1.0f;
			positions[(y*gridWidth + x)*4 + 2] = 0.0f;
			positions[(y*gridWidth + x)*4 + 3] = 1.0f;
		}
	}

	// Initialize input vectors.
	{
		int curInVec = 0;
		for (int outputNdx = 0; outputNdx < (int)m_outputs.size(); outputNdx++)
		{
			const FragmentOutput&	output		= m_outputs[outputNdx];
			bool					isFloat		= glu::isDataTypeFloatOrVec(output.type);
			bool					isInt		= glu::isDataTypeIntOrIVec(output.type);
			bool					isUint		= glu::isDataTypeUintOrUVec(output.type);
			int						numVecs		= output.arrayLength > 0 ? output.arrayLength : 1;
			int						numScalars	= glu::getDataTypeScalarSize(output.type);

			for (int vecNdx = 0; vecNdx < numVecs; vecNdx++)
			{
				inputs[curInVec].resize(numVertices*numScalars);

				// Record how many outputs are written in attachment.
				DE_ASSERT(output.location+vecNdx < (int)attachments.size());
				attachments[output.location+vecNdx].numWrittenChannels	= numScalars;
				attachments[output.location+vecNdx].outPrecision		= output.precision;

				if (isFloat)
				{
					Vec2		range	= getFloatRange(output.precision);
					Vec4		minVal	(range.x());
					Vec4		maxVal	(range.y());
					float*		dst		= (float*)&inputs[curInVec][0];

					if (de::inBounds(output.location+vecNdx, 0, (int)attachments.size()))
					{
						// \note Floating-point precision conversion is not well-defined. For that reason we must
						//       limit value range to intersection of both data type and render target value ranges.
						const tcu::TextureFormatInfo fmtInfo = tcu::getTextureFormatInfo(attachments[output.location+vecNdx].format);
						minVal = tcu::max(minVal, fmtInfo.valueMin);
						maxVal = tcu::min(maxVal, fmtInfo.valueMax);
					}

					m_testCtx.getLog() << TestLog::Message << "out" << curInVec << " value range: " << valueRangeToString(numScalars, minVal, maxVal) << TestLog::EndMessage;

					for (int y = 0; y < gridHeight; y++)
					{
						for (int x = 0; x < gridWidth; x++)
						{
							float	xf	= (float)x / (float)(gridWidth-1);
							float	yf	= (float)y / (float)(gridHeight-1);

							float	f0	= (xf + yf) * 0.5f;
							float	f1	= 0.5f + (xf - yf) * 0.5f;
							Vec4	f	= swizzleVec(Vec4(f0, f1, 1.0f-f0, 1.0f-f1), curInVec);
							Vec4	c	= minVal + (maxVal-minVal)*f;
							float*	v	= dst + (y*gridWidth + x)*numScalars;

							for (int ndx = 0; ndx < numScalars; ndx++)
								v[ndx] = c[ndx];
						}
					}
				}
				else if (isInt)
				{
					const IVec2	range	= getIntRange(output.precision);
					IVec4		minVal	(range.x());
					IVec4		maxVal	(range.y());

					if (de::inBounds(output.location+vecNdx, 0, (int)attachments.size()))
					{
						// Limit to range of output format as conversion mode is not specified.
						const IVec4 fmtBits		= tcu::getTextureFormatBitDepth(attachments[output.location+vecNdx].format);
						const BVec4	isZero		= lessThanEqual(fmtBits, IVec4(0));
						const IVec4	fmtMinVal	= (-(tcu::Vector<deInt64, 4>(1) << (fmtBits-1).cast<deInt64>())).asInt();
						const IVec4	fmtMaxVal	= ((tcu::Vector<deInt64, 4>(1) << (fmtBits-1).cast<deInt64>())-deInt64(1)).asInt();

						minVal = select(minVal, tcu::max(minVal, fmtMinVal), isZero);
						maxVal = select(maxVal, tcu::min(maxVal, fmtMaxVal), isZero);
					}

					m_testCtx.getLog() << TestLog::Message << "out" << curInVec << " value range: " << valueRangeToString(numScalars, minVal, maxVal) << TestLog::EndMessage;

					const IVec4	rangeDiv	= swizzleVec((IVec4(gridWidth, gridHeight, gridWidth, gridHeight)-1), curInVec);
					const IVec4	step		= ((maxVal.cast<deInt64>() - minVal.cast<deInt64>()) / (rangeDiv.cast<deInt64>())).asInt();
					deInt32*	dst			= (deInt32*)&inputs[curInVec][0];

					for (int y = 0; y < gridHeight; y++)
					{
						for (int x = 0; x < gridWidth; x++)
						{
							int			ix	= gridWidth - x - 1;
							int			iy	= gridHeight - y - 1;
							IVec4		c	= minVal + step*swizzleVec(IVec4(x, y, ix, iy), curInVec);
							deInt32*	v	= dst + (y*gridWidth + x)*numScalars;

							DE_ASSERT(boolAll(logicalAnd(greaterThanEqual(c, minVal), lessThanEqual(c, maxVal))));

							for (int ndx = 0; ndx < numScalars; ndx++)
								v[ndx] = c[ndx];
						}
					}
				}
				else if (isUint)
				{
					const UVec2	range	= getUintRange(output.precision);
					UVec4		maxVal	(range.y());

					if (de::inBounds(output.location+vecNdx, 0, (int)attachments.size()))
					{
						// Limit to range of output format as conversion mode is not specified.
						const IVec4	fmtBits		= tcu::getTextureFormatBitDepth(attachments[output.location+vecNdx].format);
						const UVec4	fmtMaxVal	= ((tcu::Vector<deUint64, 4>(1) << fmtBits.cast<deUint64>())-deUint64(1)).asUint();

						maxVal = tcu::min(maxVal, fmtMaxVal);
					}

					m_testCtx.getLog() << TestLog::Message << "out" << curInVec << " value range: "  << valueRangeToString(numScalars, UVec4(0), maxVal) << TestLog::EndMessage;

					const IVec4	rangeDiv	= swizzleVec((IVec4(gridWidth, gridHeight, gridWidth, gridHeight)-1), curInVec);
					const UVec4	step		= maxVal / rangeDiv.asUint();
					deUint32*	dst			= &inputs[curInVec][0];

					DE_ASSERT(range.x() == 0);

					for (int y = 0; y < gridHeight; y++)
					{
						for (int x = 0; x < gridWidth; x++)
						{
							int			ix	= gridWidth - x - 1;
							int			iy	= gridHeight - y - 1;
							UVec4		c	= step*swizzleVec(IVec4(x, y, ix, iy).asUint(), curInVec);
							deUint32*	v	= dst + (y*gridWidth + x)*numScalars;

							DE_ASSERT(boolAll(lessThanEqual(c, maxVal)));

							for (int ndx = 0; ndx < numScalars; ndx++)
								v[ndx] = c[ndx];
						}
					}
				}
				else
					DE_ASSERT(false);

				curInVec += 1;
			}
		}
	}

	// Render using gl.
	gl.useProgram(m_program->getProgram());
	gl.bindFramebuffer(GL_FRAMEBUFFER, m_framebuffer);
	gl.viewport(0, 0, viewportW, viewportH);
	gl.drawBuffers((int)drawBuffers.size(), &drawBuffers[0]);
	gl.disable(GL_DITHER); // Dithering causes issues with unorm formats. Those issues could be worked around in threshold, but it makes validation less accurate.
	GLU_EXPECT_NO_ERROR(gl.getError(), "After program setup");

	{
		int curInVec = 0;
		for (int outputNdx = 0; outputNdx < (int)m_outputs.size(); outputNdx++)
		{
			const FragmentOutput&	output			= m_outputs[outputNdx];
			bool					isArray			= output.arrayLength > 0;
			bool					isFloat			= glu::isDataTypeFloatOrVec(output.type);
			bool					isInt			= glu::isDataTypeIntOrIVec(output.type);
			bool					isUint			= glu::isDataTypeUintOrUVec(output.type);
			int						scalarSize		= glu::getDataTypeScalarSize(output.type);
			deUint32				glScalarType	= isFloat	? GL_FLOAT			:
													  isInt		? GL_INT			:
													  isUint	? GL_UNSIGNED_INT	: GL_NONE;
			int						numVecs			= isArray ? output.arrayLength : 1;

			for (int vecNdx = 0; vecNdx < numVecs; vecNdx++)
			{
				string	name	= string("in") + de::toString(outputNdx) + (isArray ? string("_") + de::toString(vecNdx) : string());
				int		loc		= gl.getAttribLocation(m_program->getProgram(), name.c_str());

				if (loc >= 0)
				{
					gl.enableVertexAttribArray(loc);
					if (isFloat)
						gl.vertexAttribPointer(loc, scalarSize, glScalarType, GL_FALSE, 0, &inputs[curInVec][0]);
					else
						gl.vertexAttribIPointer(loc, scalarSize, glScalarType, 0, &inputs[curInVec][0]);
				}
				else
					log << TestLog::Message << "Warning: No location for attribute '" << name << "' found." << TestLog::EndMessage;

				curInVec += 1;
			}
		}
	}
	{
		int posLoc = gl.getAttribLocation(m_program->getProgram(), "a_position");
		TCU_CHECK(posLoc >= 0);
		gl.enableVertexAttribArray(posLoc);
		gl.vertexAttribPointer(posLoc, 4, GL_FLOAT, GL_FALSE, 0, &positions[0]);
	}
	GLU_EXPECT_NO_ERROR(gl.getError(), "After attribute setup");

	gl.drawElements(GL_TRIANGLES, numIndices, GL_UNSIGNED_SHORT, &indices[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawElements");

	// Read all attachment points.
	for (int ndx = 0; ndx < numAttachments; ndx++)
	{
		const glu::TransferFormat		transferFmt			= glu::getTransferFormat(attachments[ndx].readFormat);
		void*							dst					= &attachments[ndx].renderedData[0];
		const int						attachmentW			= m_fboSpec[ndx].width;
		const int						attachmentH			= m_fboSpec[ndx].height;
		const int						numValidChannels	= attachments[ndx].numWrittenChannels;
		const tcu::PixelBufferAccess	rendered			(attachments[ndx].readFormat, attachmentW, attachmentH, 1, deAlign32(attachments[ndx].readFormat.getPixelSize()*attachmentW, readAlignment), 0, &attachments[ndx].renderedData[0]);

		gl.readBuffer(GL_COLOR_ATTACHMENT0+ndx);
		gl.readPixels(0, 0, minBufSize.x(), minBufSize.y(), transferFmt.format, transferFmt.dataType, dst);

		clearUndefined(rendered, numValidChannels);
	}

	// Render reference images.
	{
		int curInNdx = 0;
		for (int outputNdx = 0; outputNdx < (int)m_outputs.size(); outputNdx++)
		{
			const FragmentOutput&	output			= m_outputs[outputNdx];
			const bool				isArray			= output.arrayLength > 0;
			const bool				isFloat			= glu::isDataTypeFloatOrVec(output.type);
			const bool				isInt			= glu::isDataTypeIntOrIVec(output.type);
			const bool				isUint			= glu::isDataTypeUintOrUVec(output.type);
			const int				scalarSize		= glu::getDataTypeScalarSize(output.type);
			const int				numVecs			= isArray ? output.arrayLength : 1;

			for (int vecNdx = 0; vecNdx < numVecs; vecNdx++)
			{
				const int		location	= output.location+vecNdx;
				const void*		inputData	= &inputs[curInNdx][0];

				DE_ASSERT(de::inBounds(location, 0, (int)m_fboSpec.size()));

				const int						bufW			= m_fboSpec[location].width;
				const int						bufH			= m_fboSpec[location].height;
				const tcu::PixelBufferAccess	buf				(attachments[location].referenceFormat, bufW, bufH, 1, &attachments[location].referenceData[0]);
				const tcu::PixelBufferAccess	viewportBuf		= getSubregion(buf, 0, 0, 0, viewportW, viewportH, 1);

				if (isInt || isUint)
					renderIntReference(viewportBuf, gridWidth, gridHeight, scalarSize, (const int*)inputData);
				else if (isFloat)
					renderFloatReference(viewportBuf, gridWidth, gridHeight, scalarSize, (const float*)inputData);
				else
					DE_ASSERT(false);

				curInNdx += 1;
			}
		}
	}

	// Compare all images.
	bool allLevelsOk = true;
	for (int attachNdx = 0; attachNdx < numAttachments; attachNdx++)
	{
		const int						attachmentW			= m_fboSpec[attachNdx].width;
		const int						attachmentH			= m_fboSpec[attachNdx].height;
		const int						numValidChannels	= attachments[attachNdx].numWrittenChannels;
		const tcu::BVec4				cmpMask				(numValidChannels >= 1, numValidChannels >= 2, numValidChannels >= 3, numValidChannels >= 4);
		const glu::Precision			outPrecision		= attachments[attachNdx].outPrecision;
		const tcu::TextureFormat&		format				= attachments[attachNdx].format;
		tcu::ConstPixelBufferAccess		rendered			(attachments[attachNdx].readFormat, attachmentW, attachmentH, 1, deAlign32(attachments[attachNdx].readFormat.getPixelSize()*attachmentW, readAlignment), 0, &attachments[attachNdx].renderedData[0]);
		tcu::ConstPixelBufferAccess		reference			(attachments[attachNdx].referenceFormat, attachmentW, attachmentH, 1, &attachments[attachNdx].referenceData[0]);
		tcu::TextureChannelClass		texClass			= tcu::getTextureChannelClass(format.type);
		bool							isOk				= true;
		const string					name				= string("Attachment") + de::toString(attachNdx);
		const string					desc				= string("Color attachment ") + de::toString(attachNdx);

		log << TestLog::Message << "Attachment " << attachNdx << ": " << numValidChannels << " channels have defined values and used for comparison" << TestLog::EndMessage;

		switch (texClass)
		{
			case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
			{
				const deUint32	interpThreshold		= 4;	//!< 4 ULP interpolation threshold (interpolation always in highp)
				deUint32		outTypeThreshold	= 0;	//!< Threshold based on output type
				UVec4			formatThreshold;			//!< Threshold computed based on format.
				UVec4			finalThreshold;

				// 1 ULP rounding error is allowed for smaller floating-point formats
				switch (format.type)
				{
					case tcu::TextureFormat::FLOAT:							formatThreshold = UVec4(0);											break;
					case tcu::TextureFormat::HALF_FLOAT:					formatThreshold = UVec4((1<<(23-10)));								break;
					case tcu::TextureFormat::UNSIGNED_INT_11F_11F_10F_REV:	formatThreshold = UVec4((1<<(23-6)), (1<<(23-6)), (1<<(23-5)), 0);	break;
					default:
						DE_ASSERT(false);
						break;
				}

				// 1 ULP rounding error for highp -> output precision cast
				switch (outPrecision)
				{
					case glu::PRECISION_LOWP:		outTypeThreshold	= (1<<(23-8));	break;
					case glu::PRECISION_MEDIUMP:	outTypeThreshold	= (1<<(23-10));	break;
					case glu::PRECISION_HIGHP:		outTypeThreshold	= 0;			break;
					default:
						DE_ASSERT(false);
				}

				finalThreshold = select(max(formatThreshold, UVec4(deMax32(interpThreshold, outTypeThreshold))), UVec4(~0u), cmpMask);

				isOk = tcu::floatUlpThresholdCompare(log, name.c_str(), desc.c_str(), reference, rendered, finalThreshold, tcu::COMPARE_LOG_RESULT);
				break;
			}

			case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
			{
				// \note glReadPixels() allows only 8 bits to be read. This means that RGB10_A2 will loose some
				// bits in the process and it must be taken into account when computing threshold.
				const IVec4		bits			= min(IVec4(8), tcu::getTextureFormatBitDepth(format));
				const Vec4		baseThreshold	= 1.0f / ((IVec4(1) << bits)-1).asFloat();
				const Vec4		threshold		= select(baseThreshold, Vec4(2.0f), cmpMask);

				isOk = tcu::floatThresholdCompare(log, name.c_str(), desc.c_str(), reference, rendered, threshold, tcu::COMPARE_LOG_RESULT);
				break;
			}

			case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
			case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
			{
				const tcu::UVec4 threshold = select(UVec4(0u), UVec4(~0u), cmpMask);
				isOk = tcu::intThresholdCompare(log, name.c_str(), desc.c_str(), reference, rendered, threshold, tcu::COMPARE_LOG_RESULT);
				break;
			}

			default:
				TCU_FAIL("Unsupported comparison");
				break;
		}

		if (!isOk)
			allLevelsOk = false;
	}

	m_testCtx.setTestResult(allLevelsOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							allLevelsOk ? "Pass"				: "Image comparison failed");
	return STOP;
}